

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::~Graph(Graph *this)

{
  Edge *local_28;
  Edge *e;
  Vertex *v;
  Vertex *aux;
  Graph *this_local;
  
  v = (Vertex *)operator_new(0x78);
  Vertex::Vertex(v,0,1);
  for (e = (Edge *)this->verticesList; e != (Edge *)0x0; e = (Edge *)Vertex::getNext((Vertex *)e)) {
    if (v != (Vertex *)0x0) {
      Vertex::~Vertex(v);
      operator_delete(v,0x78);
    }
    for (local_28 = Vertex::getEdgesList((Vertex *)e); local_28 != (Edge *)0x0;
        local_28 = Edge::getNext(local_28)) {
      if (local_28 != (Edge *)0x0) {
        Edge::~Edge(local_28);
        operator_delete(local_28,0x60);
      }
    }
    v = (Vertex *)e;
  }
  if (v != (Vertex *)0x0) {
    Vertex::~Vertex(v);
    operator_delete(v,0x78);
  }
  std::vector<LoadLevel,_std::allocator<LoadLevel>_>::~vector(&this->loads);
  std::vector<Capacitor,_std::allocator<Capacitor>_>::~vector(&this->capacitorType);
  return;
}

Assistant:

Graph::~Graph(){
    Vertex *aux = new Vertex(0);
    for(Vertex *v=this->verticesList; v != NULL; v= v->getNext()){
        delete aux;
        for(Edge *e= v->getEdgesList(); e != NULL; e= e->getNext()){
            delete e;
        }
        aux = v;
    }
    delete aux;
}